

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersector1<8,_16777232,_true,_embree::avx::ArrayIntersector1<embree::avx::TriangleMvMBIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  Geometry *pGVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  byte bVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  AABBNodeMB4D *node1;
  ulong uVar23;
  uint uVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  long lVar28;
  ulong *puVar29;
  ulong uVar30;
  Scene *pSVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  undefined1 auVar35 [16];
  float fVar43;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar42;
  undefined1 auVar41 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar53 [32];
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar54 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar57 [16];
  float fVar55;
  float fVar71;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar56;
  float fVar67;
  float fVar69;
  float fVar70;
  float fVar72;
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  float fVar66;
  float fVar68;
  undefined1 auVar65 [64];
  float fVar73;
  float fVar86;
  float fVar87;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar88;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [64];
  float fVar89;
  float fVar99;
  float fVar101;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar103;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar90;
  float fVar100;
  float fVar102;
  float fVar104;
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [64];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [64];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [64];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [64];
  float fVar122;
  float fVar123;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar132;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  float fVar130;
  float fVar131;
  undefined1 auVar129 [64];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [64];
  undefined1 auVar137 [16];
  undefined1 auVar138 [64];
  float fVar139;
  undefined1 auVar140 [16];
  float fVar142;
  float fVar143;
  float fVar144;
  undefined1 auVar141 [64];
  float fVar145;
  undefined1 auVar146 [16];
  float fVar148;
  float fVar149;
  float fVar150;
  undefined1 auVar147 [64];
  float fVar151;
  undefined1 auVar152 [16];
  float fVar154;
  float fVar155;
  float fVar156;
  undefined1 auVar153 [64];
  float fVar157;
  undefined1 auVar158 [16];
  float fVar163;
  undefined1 auVar159 [16];
  float fVar161;
  float fVar162;
  undefined1 auVar160 [64];
  float fVar164;
  float fVar166;
  float fVar167;
  float fVar168;
  undefined1 auVar165 [64];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  undefined1 local_1559;
  undefined8 local_1558;
  float fStack_1550;
  float fStack_154c;
  int local_153c;
  undefined8 local_1538;
  float fStack_1530;
  float fStack_152c;
  undefined8 local_1528;
  float fStack_1520;
  float fStack_151c;
  RayQueryContext *local_1510;
  undefined1 local_1508 [16];
  undefined1 local_14f8 [16];
  undefined1 local_14e8 [16];
  undefined1 local_14d8 [16];
  undefined1 local_14c8 [16];
  undefined1 local_14b8 [16];
  undefined1 local_14a8 [16];
  undefined1 local_1498 [16];
  long local_1480;
  uint local_1478;
  uint local_1474;
  uint local_1470;
  undefined4 local_146c;
  undefined4 local_1468;
  undefined4 local_1464;
  uint local_1460;
  uint local_145c;
  uint local_1458;
  RTCFilterFunctionNArguments local_1448;
  undefined8 local_1418;
  undefined8 uStack_1410;
  undefined1 local_1408 [16];
  undefined1 local_13f8 [16];
  undefined1 local_13e8 [16];
  undefined1 local_13d8 [16];
  undefined1 local_13c8 [16];
  undefined1 *local_13b8;
  undefined1 local_13a8 [16];
  undefined1 local_1398 [16];
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  undefined1 local_1368 [16];
  undefined1 local_1358 [16];
  undefined1 local_1348 [16];
  undefined1 local_1338 [32];
  undefined1 local_1318 [32];
  undefined1 local_12f8 [32];
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  ulong local_11d8 [565];
  
  local_11d8[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8[0] != 8) {
    fVar3 = ray->tfar;
    auVar65 = ZEXT1664(ZEXT816(0) << 0x40);
    if (0.0 <= fVar3) {
      local_1510 = context;
      puVar29 = local_11d8 + 1;
      aVar5 = (ray->dir).field_0;
      auVar96 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar91._8_4_ = 0x7fffffff;
      auVar91._0_8_ = 0x7fffffff7fffffff;
      auVar91._12_4_ = 0x7fffffff;
      auVar91 = vandps_avx((undefined1  [16])aVar5,auVar91);
      auVar44._8_4_ = 0x219392ef;
      auVar44._0_8_ = 0x219392ef219392ef;
      auVar44._12_4_ = 0x219392ef;
      auVar91 = vcmpps_avx(auVar91,auVar44,1);
      auVar105._8_4_ = 0x3f800000;
      auVar105._0_8_ = 0x3f8000003f800000;
      auVar105._12_4_ = 0x3f800000;
      auVar44 = vdivps_avx(auVar105,(undefined1  [16])aVar5);
      auVar106._8_4_ = 0x5d5e0b6b;
      auVar106._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar106._12_4_ = 0x5d5e0b6b;
      auVar91 = vblendvps_avx(auVar44,auVar106,auVar91);
      auVar92._0_4_ = auVar91._0_4_ * 0.99999964;
      auVar92._4_4_ = auVar91._4_4_ * 0.99999964;
      auVar92._8_4_ = auVar91._8_4_ * 0.99999964;
      auVar92._12_4_ = auVar91._12_4_ * 0.99999964;
      uVar4 = *(undefined4 *)&(ray->org).field_0;
      local_11f8._4_4_ = uVar4;
      local_11f8._0_4_ = uVar4;
      local_11f8._8_4_ = uVar4;
      local_11f8._12_4_ = uVar4;
      local_11f8._16_4_ = uVar4;
      local_11f8._20_4_ = uVar4;
      local_11f8._24_4_ = uVar4;
      local_11f8._28_4_ = uVar4;
      auVar121 = ZEXT3264(local_11f8);
      uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_1218._4_4_ = uVar4;
      local_1218._0_4_ = uVar4;
      local_1218._8_4_ = uVar4;
      local_1218._12_4_ = uVar4;
      local_1218._16_4_ = uVar4;
      local_1218._20_4_ = uVar4;
      local_1218._24_4_ = uVar4;
      local_1218._28_4_ = uVar4;
      auVar129 = ZEXT3264(local_1218);
      uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_1238._4_4_ = uVar4;
      local_1238._0_4_ = uVar4;
      local_1238._8_4_ = uVar4;
      local_1238._12_4_ = uVar4;
      local_1238._16_4_ = uVar4;
      local_1238._20_4_ = uVar4;
      local_1238._24_4_ = uVar4;
      local_1238._28_4_ = uVar4;
      auVar136 = ZEXT3264(local_1238);
      auVar74._0_4_ = auVar91._0_4_ * 1.0000004;
      auVar74._4_4_ = auVar91._4_4_ * 1.0000004;
      auVar74._8_4_ = auVar91._8_4_ * 1.0000004;
      auVar74._12_4_ = auVar91._12_4_ * 1.0000004;
      auVar91 = vshufps_avx(auVar92,auVar92,0);
      local_1258._16_16_ = auVar91;
      local_1258._0_16_ = auVar91;
      auVar138 = ZEXT3264(local_1258);
      auVar91 = vmovshdup_avx(auVar92);
      auVar44 = vshufps_avx(auVar92,auVar92,0x55);
      local_1278._16_16_ = auVar44;
      local_1278._0_16_ = auVar44;
      auVar141 = ZEXT3264(local_1278);
      auVar44 = vshufpd_avx(auVar92,auVar92,1);
      auVar105 = vshufps_avx(auVar92,auVar92,0xaa);
      local_1298._16_16_ = auVar105;
      local_1298._0_16_ = auVar105;
      auVar147 = ZEXT3264(local_1298);
      auVar105 = vshufps_avx(auVar74,auVar74,0);
      local_12b8._16_16_ = auVar105;
      local_12b8._0_16_ = auVar105;
      auVar153 = ZEXT3264(local_12b8);
      uVar30 = (ulong)(auVar92._0_4_ < 0.0) << 5;
      auVar105 = vshufps_avx(auVar74,auVar74,0x55);
      auVar98 = ZEXT1664(auVar105);
      local_12d8._16_16_ = auVar105;
      local_12d8._0_16_ = auVar105;
      auVar111 = ZEXT3264(local_12d8);
      auVar105 = vshufps_avx(auVar74,auVar74,0xaa);
      auVar85 = ZEXT1664(auVar105);
      uVar32 = (ulong)(auVar91._0_4_ < 0.0) << 5 | 0x40;
      local_12f8._16_16_ = auVar105;
      local_12f8._0_16_ = auVar105;
      auVar115 = ZEXT3264(local_12f8);
      uVar27 = (ulong)(auVar44._0_4_ < 0.0) << 5 | 0x80;
      uVar33 = uVar30 ^ 0x20;
      auVar91 = vshufps_avx(auVar96,auVar96,0);
      auVar54 = ZEXT1664(auVar91);
      local_1318._16_16_ = auVar91;
      local_1318._0_16_ = auVar91;
      auVar160 = ZEXT3264(local_1318);
      auVar91 = vshufps_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),0);
      local_1338._16_16_ = auVar91;
      local_1338._0_16_ = auVar91;
      auVar165 = ZEXT3264(local_1338);
      local_1418 = mm_lookupmask_ps._240_8_;
      uStack_1410 = mm_lookupmask_ps._248_8_;
LAB_00e60d92:
      if (puVar29 != local_11d8) {
        uVar34 = puVar29[-1];
        puVar29 = puVar29 + -1;
        do {
          fVar3 = (ray->dir).field_0.m128[3];
          auVar41._4_4_ = fVar3;
          auVar41._0_4_ = fVar3;
          auVar41._8_4_ = fVar3;
          auVar41._12_4_ = fVar3;
          auVar41._16_4_ = fVar3;
          auVar41._20_4_ = fVar3;
          auVar41._24_4_ = fVar3;
          auVar41._28_4_ = fVar3;
          do {
            if ((uVar34 & 8) != 0) {
              lVar28 = (ulong)((uint)uVar34 & 0xf) - 8;
              uVar34 = uVar34 & 0xfffffffffffffff0;
              local_1480 = 0;
              goto LAB_00e60f3a;
            }
            uVar23 = uVar34 & 0xfffffffffffffff0;
            pfVar2 = (float *)(uVar23 + 0x100 + uVar30);
            pfVar1 = (float *)(uVar23 + 0x40 + uVar30);
            auVar53._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar53._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar53._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar53._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            auVar53._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
            auVar53._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
            auVar53._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
            auVar53._28_4_ = auVar54._28_4_ + pfVar1[7];
            auVar53 = vsubps_avx(auVar53,auVar121._0_32_);
            auVar16._4_4_ = auVar138._4_4_ * auVar53._4_4_;
            auVar16._0_4_ = auVar138._0_4_ * auVar53._0_4_;
            auVar16._8_4_ = auVar138._8_4_ * auVar53._8_4_;
            auVar16._12_4_ = auVar138._12_4_ * auVar53._12_4_;
            auVar16._16_4_ = auVar138._16_4_ * auVar53._16_4_;
            auVar16._20_4_ = auVar138._20_4_ * auVar53._20_4_;
            auVar16._24_4_ = auVar138._24_4_ * auVar53._24_4_;
            auVar16._28_4_ = auVar53._28_4_;
            auVar53 = vmaxps_avx(auVar160._0_32_,auVar16);
            pfVar2 = (float *)(uVar23 + 0x100 + uVar32);
            pfVar1 = (float *)(uVar23 + 0x40 + uVar32);
            auVar63._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar63._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar63._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar63._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            auVar63._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
            auVar63._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
            auVar63._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
            auVar63._28_4_ = auVar65._28_4_ + pfVar1[7];
            auVar16 = vsubps_avx(auVar63,auVar129._0_32_);
            auVar15._4_4_ = auVar141._4_4_ * auVar16._4_4_;
            auVar15._0_4_ = auVar141._0_4_ * auVar16._0_4_;
            auVar15._8_4_ = auVar141._8_4_ * auVar16._8_4_;
            auVar15._12_4_ = auVar141._12_4_ * auVar16._12_4_;
            auVar15._16_4_ = auVar141._16_4_ * auVar16._16_4_;
            auVar15._20_4_ = auVar141._20_4_ * auVar16._20_4_;
            auVar15._24_4_ = auVar141._24_4_ * auVar16._24_4_;
            auVar15._28_4_ = auVar16._28_4_;
            pfVar2 = (float *)(uVar23 + 0x100 + uVar27);
            pfVar1 = (float *)(uVar23 + 0x40 + uVar27);
            auVar83._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar83._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar83._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar83._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            auVar83._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
            auVar83._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
            auVar83._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
            auVar83._28_4_ = auVar85._28_4_ + pfVar1[7];
            auVar17 = vsubps_avx(auVar83,auVar136._0_32_);
            auVar19._4_4_ = auVar147._4_4_ * auVar17._4_4_;
            auVar19._0_4_ = auVar147._0_4_ * auVar17._0_4_;
            auVar19._8_4_ = auVar147._8_4_ * auVar17._8_4_;
            auVar19._12_4_ = auVar147._12_4_ * auVar17._12_4_;
            auVar19._16_4_ = auVar147._16_4_ * auVar17._16_4_;
            auVar19._20_4_ = auVar147._20_4_ * auVar17._20_4_;
            auVar19._24_4_ = auVar147._24_4_ * auVar17._24_4_;
            auVar19._28_4_ = auVar17._28_4_;
            auVar16 = vmaxps_avx(auVar15,auVar19);
            auVar53 = vmaxps_avx(auVar53,auVar16);
            pfVar2 = (float *)(uVar23 + 0x100 + uVar33);
            pfVar1 = (float *)(uVar23 + 0x40 + uVar33);
            auVar64._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar64._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar64._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar64._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            auVar64._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
            auVar64._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
            auVar64._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
            auVar64._28_4_ = auVar16._28_4_ + pfVar1[7];
            auVar16 = vsubps_avx(auVar64,auVar121._0_32_);
            auVar20._4_4_ = auVar153._4_4_ * auVar16._4_4_;
            auVar20._0_4_ = auVar153._0_4_ * auVar16._0_4_;
            auVar20._8_4_ = auVar153._8_4_ * auVar16._8_4_;
            auVar20._12_4_ = auVar153._12_4_ * auVar16._12_4_;
            auVar20._16_4_ = auVar153._16_4_ * auVar16._16_4_;
            auVar20._20_4_ = auVar153._20_4_ * auVar16._20_4_;
            auVar20._24_4_ = auVar153._24_4_ * auVar16._24_4_;
            auVar20._28_4_ = auVar16._28_4_;
            pfVar2 = (float *)(uVar23 + 0x100 + (uVar32 ^ 0x20));
            auVar15 = vminps_avx(auVar165._0_32_,auVar20);
            pfVar1 = (float *)(uVar23 + 0x40 + (uVar32 ^ 0x20));
            auVar84._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar84._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar84._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar84._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            auVar84._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
            auVar84._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
            auVar84._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
            auVar84._28_4_ = auVar17._28_4_ + pfVar1[7];
            auVar16 = vsubps_avx(auVar84,auVar129._0_32_);
            pfVar2 = (float *)(uVar23 + 0x100 + (uVar27 ^ 0x20));
            pfVar1 = (float *)(uVar23 + 0x40 + (uVar27 ^ 0x20));
            auVar97._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar97._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar97._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar97._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            auVar97._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
            auVar97._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
            auVar97._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
            auVar97._28_4_ = auVar98._28_4_ + pfVar1[7];
            auVar17._4_4_ = auVar111._4_4_ * auVar16._4_4_;
            auVar17._0_4_ = auVar111._0_4_ * auVar16._0_4_;
            auVar17._8_4_ = auVar111._8_4_ * auVar16._8_4_;
            auVar17._12_4_ = auVar111._12_4_ * auVar16._12_4_;
            auVar17._16_4_ = auVar111._16_4_ * auVar16._16_4_;
            auVar17._20_4_ = auVar111._20_4_ * auVar16._20_4_;
            auVar17._24_4_ = auVar111._24_4_ * auVar16._24_4_;
            auVar17._28_4_ = auVar16._28_4_;
            auVar16 = vsubps_avx(auVar97,auVar136._0_32_);
            auVar21._4_4_ = auVar115._4_4_ * auVar16._4_4_;
            auVar21._0_4_ = auVar115._0_4_ * auVar16._0_4_;
            auVar21._8_4_ = auVar115._8_4_ * auVar16._8_4_;
            auVar21._12_4_ = auVar115._12_4_ * auVar16._12_4_;
            auVar21._16_4_ = auVar115._16_4_ * auVar16._16_4_;
            auVar21._20_4_ = auVar115._20_4_ * auVar16._20_4_;
            auVar21._24_4_ = auVar115._24_4_ * auVar16._24_4_;
            auVar21._28_4_ = auVar16._28_4_;
            auVar98 = ZEXT3264(auVar21);
            auVar16 = vminps_avx(auVar17,auVar21);
            auVar15 = vminps_avx(auVar15,auVar16);
            auVar53 = vcmpps_avx(auVar53,auVar15,2);
            if (((uint)uVar34 & 7) == 6) {
              auVar15 = vcmpps_avx(*(undefined1 (*) [32])(uVar23 + 0x1c0),auVar41,2);
              auVar16 = vcmpps_avx(auVar41,*(undefined1 (*) [32])(uVar23 + 0x1e0),1);
              auVar15 = vandps_avx(auVar15,auVar16);
              auVar53 = vandps_avx(auVar15,auVar53);
            }
            auVar85 = ZEXT3264(auVar16);
            auVar91 = vpackssdw_avx(auVar53._0_16_,auVar53._16_16_);
            auVar44 = vpsllw_avx(auVar91,0xf);
            auVar54 = ZEXT1664(auVar44);
            auVar91 = vpacksswb_avx(auVar44,auVar44);
            auVar65 = ZEXT1664(auVar91);
            bVar18 = SUB161(auVar91 >> 7,0) & 1 | (SUB161(auVar91 >> 0xf,0) & 1) << 1 |
                     (SUB161(auVar91 >> 0x17,0) & 1) << 2 | (SUB161(auVar91 >> 0x1f,0) & 1) << 3 |
                     (SUB161(auVar91 >> 0x27,0) & 1) << 4 | (SUB161(auVar91 >> 0x2f,0) & 1) << 5 |
                     (SUB161(auVar91 >> 0x37,0) & 1) << 6 | SUB161(auVar91 >> 0x3f,0) << 7;
            if ((((((((auVar44 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar44 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar44 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar44 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar44 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar44 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar44 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < auVar44[0xf]) goto LAB_00e60d92;
            lVar28 = 0;
            if (bVar18 != 0) {
              for (; (bVar18 >> lVar28 & 1) == 0; lVar28 = lVar28 + 1) {
              }
            }
            uVar34 = *(ulong *)(uVar23 + lVar28 * 8);
            uVar24 = bVar18 - 1 & (uint)bVar18;
            uVar25 = (ulong)uVar24;
          } while (uVar24 == 0);
          do {
            *puVar29 = uVar34;
            puVar29 = puVar29 + 1;
            lVar28 = 0;
            if (uVar25 != 0) {
              for (; (uVar25 >> lVar28 & 1) == 0; lVar28 = lVar28 + 1) {
              }
            }
            uVar34 = *(ulong *)(uVar23 + lVar28 * 8);
            uVar25 = uVar25 - 1 & uVar25;
          } while (uVar25 != 0);
        } while( true );
      }
    }
  }
  return;
LAB_00e60f3a:
  if (local_1480 == lVar28) goto LAB_00e60d92;
  lVar26 = local_1480 * 0x140;
  fVar3 = (ray->dir).field_0.m128[3];
  pfVar2 = (float *)(uVar34 + 0x90 + lVar26);
  pfVar1 = (float *)(uVar34 + lVar26);
  auVar45._0_4_ = fVar3 * *pfVar2 + *pfVar1;
  auVar45._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
  auVar45._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
  auVar45._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
  pfVar2 = (float *)(uVar34 + 0xa0 + lVar26);
  pfVar1 = (float *)(uVar34 + 0x10 + lVar26);
  auVar57._0_4_ = fVar3 * *pfVar2 + *pfVar1;
  auVar57._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
  auVar57._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
  auVar57._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
  pfVar2 = (float *)(uVar34 + 0xb0 + lVar26);
  pfVar1 = (float *)(uVar34 + 0x20 + lVar26);
  auVar140._0_4_ = fVar3 * *pfVar2 + *pfVar1;
  auVar140._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
  auVar140._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
  auVar140._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
  pfVar2 = (float *)(uVar34 + 0xc0 + lVar26);
  pfVar1 = (float *)(uVar34 + 0x30 + lVar26);
  auVar93._0_4_ = fVar3 * *pfVar2 + *pfVar1;
  auVar93._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
  auVar93._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
  auVar93._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
  pfVar2 = (float *)(uVar34 + 0xd0 + lVar26);
  pfVar1 = (float *)(uVar34 + 0x40 + lVar26);
  auVar107._0_4_ = fVar3 * *pfVar2 + *pfVar1;
  auVar107._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
  auVar107._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
  auVar107._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
  pfVar2 = (float *)(uVar34 + 0xe0 + lVar26);
  pfVar1 = (float *)(uVar34 + 0x50 + lVar26);
  auVar146._0_4_ = fVar3 * *pfVar2 + *pfVar1;
  auVar146._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
  auVar146._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
  auVar146._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
  pfVar2 = (float *)(uVar34 + 0xf0 + lVar26);
  pfVar1 = (float *)(uVar34 + 0x60 + lVar26);
  auVar124._0_4_ = fVar3 * *pfVar2 + *pfVar1;
  auVar124._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
  auVar124._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
  auVar124._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
  pfVar2 = (float *)(uVar34 + 0x100 + lVar26);
  pfVar1 = (float *)(uVar34 + 0x70 + lVar26);
  auVar133._0_4_ = fVar3 * *pfVar2 + *pfVar1;
  auVar133._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
  auVar133._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
  auVar133._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
  pfVar1 = (float *)(uVar34 + 0x110 + lVar26);
  pfVar2 = (float *)(uVar34 + 0x80 + lVar26);
  auVar35._0_4_ = fVar3 * *pfVar1 + *pfVar2;
  auVar35._4_4_ = fVar3 * pfVar1[1] + pfVar2[1];
  auVar35._8_4_ = fVar3 * pfVar1[2] + pfVar2[2];
  auVar35._12_4_ = fVar3 * pfVar1[3] + pfVar2[3];
  uVar4 = *(undefined4 *)&(ray->org).field_0;
  auVar137._4_4_ = uVar4;
  auVar137._0_4_ = uVar4;
  auVar137._8_4_ = uVar4;
  auVar137._12_4_ = uVar4;
  uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
  auVar152._4_4_ = uVar4;
  auVar152._0_4_ = uVar4;
  auVar152._8_4_ = uVar4;
  auVar152._12_4_ = uVar4;
  uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
  auVar158._4_4_ = uVar4;
  auVar158._0_4_ = uVar4;
  auVar158._8_4_ = uVar4;
  auVar158._12_4_ = uVar4;
  local_1498 = vsubps_avx(auVar45,auVar137);
  local_14f8 = vsubps_avx(auVar57,auVar152);
  local_1508 = vsubps_avx(auVar140,auVar158);
  auVar91 = vsubps_avx(auVar93,auVar137);
  auVar44 = vsubps_avx(auVar107,auVar152);
  auVar96 = vsubps_avx(auVar146,auVar158);
  auVar105 = vsubps_avx(auVar124,auVar137);
  auVar74 = vsubps_avx(auVar133,auVar152);
  auVar92 = vsubps_avx(auVar35,auVar158);
  local_14a8 = vsubps_avx(auVar105,local_1498);
  local_14b8 = vsubps_avx(auVar74,local_14f8);
  local_14c8 = vsubps_avx(auVar92,local_1508);
  fVar3 = local_14f8._0_4_;
  fVar55 = auVar74._0_4_ + fVar3;
  fVar9 = local_14f8._4_4_;
  fVar66 = auVar74._4_4_ + fVar9;
  fVar72 = local_14f8._8_4_;
  fVar68 = auVar74._8_4_ + fVar72;
  fVar12 = local_14f8._12_4_;
  fVar71 = auVar74._12_4_ + fVar12;
  fVar7 = local_1508._0_4_;
  fVar89 = auVar92._0_4_ + fVar7;
  fVar67 = local_1508._4_4_;
  fVar99 = auVar92._4_4_ + fVar67;
  fVar10 = local_1508._8_4_;
  fVar101 = auVar92._8_4_ + fVar10;
  fVar13 = local_1508._12_4_;
  fVar103 = auVar92._12_4_ + fVar13;
  fVar56 = local_14c8._0_4_;
  auVar125._0_4_ = fVar56 * fVar55;
  fVar69 = local_14c8._4_4_;
  auVar125._4_4_ = fVar69 * fVar66;
  fVar42 = local_14c8._8_4_;
  auVar125._8_4_ = fVar42 * fVar68;
  fVar43 = local_14c8._12_4_;
  auVar125._12_4_ = fVar43 * fVar71;
  fVar164 = local_14b8._0_4_;
  auVar134._0_4_ = fVar164 * fVar89;
  fVar166 = local_14b8._4_4_;
  auVar134._4_4_ = fVar166 * fVar99;
  fVar167 = local_14b8._8_4_;
  auVar134._8_4_ = fVar167 * fVar101;
  fVar168 = local_14b8._12_4_;
  auVar134._12_4_ = fVar168 * fVar103;
  auVar106 = vsubps_avx(auVar134,auVar125);
  fVar8 = local_1498._0_4_;
  fVar122 = auVar105._0_4_ + fVar8;
  fVar70 = local_1498._4_4_;
  fVar130 = auVar105._4_4_ + fVar70;
  fVar11 = local_1498._8_4_;
  fVar131 = auVar105._8_4_ + fVar11;
  fVar14 = local_1498._12_4_;
  fVar132 = auVar105._12_4_ + fVar14;
  fVar157 = local_14a8._0_4_;
  auVar94._0_4_ = fVar157 * fVar89;
  fVar161 = local_14a8._4_4_;
  auVar94._4_4_ = fVar161 * fVar99;
  fVar162 = local_14a8._8_4_;
  auVar94._8_4_ = fVar162 * fVar101;
  fVar163 = local_14a8._12_4_;
  auVar94._12_4_ = fVar163 * fVar103;
  auVar135._0_4_ = fVar122 * fVar56;
  auVar135._4_4_ = fVar130 * fVar69;
  auVar135._8_4_ = fVar131 * fVar42;
  auVar135._12_4_ = fVar132 * fVar43;
  auVar35 = vsubps_avx(auVar135,auVar94);
  auVar126._0_4_ = fVar164 * fVar122;
  auVar126._4_4_ = fVar166 * fVar130;
  auVar126._8_4_ = fVar167 * fVar131;
  auVar126._12_4_ = fVar168 * fVar132;
  auVar36._0_4_ = fVar157 * fVar55;
  auVar36._4_4_ = fVar161 * fVar66;
  auVar36._8_4_ = fVar162 * fVar68;
  auVar36._12_4_ = fVar163 * fVar71;
  auVar36 = vsubps_avx(auVar36,auVar126);
  local_1528._4_4_ = (ray->dir).field_0.m128[2];
  local_1558._4_4_ = (ray->dir).field_0.m128[1];
  local_1538._4_4_ = (ray->dir).field_0.m128[0];
  local_14e8._0_4_ =
       auVar106._0_4_ * local_1538._4_4_ +
       local_1558._4_4_ * auVar35._0_4_ + local_1528._4_4_ * auVar36._0_4_;
  local_14e8._4_4_ =
       auVar106._4_4_ * local_1538._4_4_ +
       local_1558._4_4_ * auVar35._4_4_ + local_1528._4_4_ * auVar36._4_4_;
  local_14e8._8_4_ =
       auVar106._8_4_ * local_1538._4_4_ +
       local_1558._4_4_ * auVar35._8_4_ + local_1528._4_4_ * auVar36._8_4_;
  local_14e8._12_4_ =
       auVar106._12_4_ * local_1538._4_4_ +
       local_1558._4_4_ * auVar35._12_4_ + local_1528._4_4_ * auVar36._12_4_;
  local_14d8 = vsubps_avx(local_14f8,auVar44);
  auVar106 = vsubps_avx(local_1508,auVar96);
  fVar55 = fVar3 + auVar44._0_4_;
  fVar66 = fVar9 + auVar44._4_4_;
  fVar68 = fVar72 + auVar44._8_4_;
  fVar71 = fVar12 + auVar44._12_4_;
  fVar99 = auVar96._0_4_ + fVar7;
  fVar103 = auVar96._4_4_ + fVar67;
  fVar130 = auVar96._8_4_ + fVar10;
  fVar132 = auVar96._12_4_ + fVar13;
  fVar151 = auVar106._0_4_;
  auVar159._0_4_ = fVar151 * fVar55;
  fVar154 = auVar106._4_4_;
  auVar159._4_4_ = fVar154 * fVar66;
  fVar155 = auVar106._8_4_;
  auVar159._8_4_ = fVar155 * fVar68;
  fVar156 = auVar106._12_4_;
  auVar159._12_4_ = fVar156 * fVar71;
  fVar89 = local_14d8._0_4_;
  auVar75._0_4_ = fVar89 * fVar99;
  fVar101 = local_14d8._4_4_;
  auVar75._4_4_ = fVar101 * fVar103;
  fVar122 = local_14d8._8_4_;
  auVar75._8_4_ = fVar122 * fVar130;
  fVar131 = local_14d8._12_4_;
  auVar75._12_4_ = fVar131 * fVar132;
  auVar106 = vsubps_avx(auVar75,auVar159);
  auVar35 = vsubps_avx(local_1498,auVar91);
  fVar139 = auVar35._0_4_;
  auVar95._0_4_ = fVar139 * fVar99;
  fVar142 = auVar35._4_4_;
  auVar95._4_4_ = fVar142 * fVar103;
  fVar143 = auVar35._8_4_;
  auVar95._8_4_ = fVar143 * fVar130;
  fVar144 = auVar35._12_4_;
  auVar95._12_4_ = fVar144 * fVar132;
  fVar99 = auVar91._0_4_ + fVar8;
  fVar103 = auVar91._4_4_ + fVar70;
  fVar130 = auVar91._8_4_ + fVar11;
  fVar132 = auVar91._12_4_ + fVar14;
  auVar127._0_4_ = fVar151 * fVar99;
  auVar127._4_4_ = fVar154 * fVar103;
  auVar127._8_4_ = fVar155 * fVar130;
  auVar127._12_4_ = fVar156 * fVar132;
  auVar35 = vsubps_avx(auVar127,auVar95);
  auVar116._0_4_ = fVar89 * fVar99;
  auVar116._4_4_ = fVar101 * fVar103;
  auVar116._8_4_ = fVar122 * fVar130;
  auVar116._12_4_ = fVar131 * fVar132;
  auVar37._0_4_ = fVar139 * fVar55;
  auVar37._4_4_ = fVar142 * fVar66;
  auVar37._8_4_ = fVar143 * fVar68;
  auVar37._12_4_ = fVar144 * fVar71;
  auVar36 = vsubps_avx(auVar37,auVar116);
  local_13f8._0_4_ =
       local_1538._4_4_ * auVar106._0_4_ +
       local_1558._4_4_ * auVar35._0_4_ + local_1528._4_4_ * auVar36._0_4_;
  local_13f8._4_4_ =
       local_1538._4_4_ * auVar106._4_4_ +
       local_1558._4_4_ * auVar35._4_4_ + local_1528._4_4_ * auVar36._4_4_;
  local_13f8._8_4_ =
       local_1538._4_4_ * auVar106._8_4_ +
       local_1558._4_4_ * auVar35._8_4_ + local_1528._4_4_ * auVar36._8_4_;
  local_13f8._12_4_ =
       local_1538._4_4_ * auVar106._12_4_ +
       local_1558._4_4_ * auVar35._12_4_ + local_1528._4_4_ * auVar36._12_4_;
  auVar106 = vsubps_avx(auVar91,auVar105);
  fVar73 = auVar91._0_4_ + auVar105._0_4_;
  fVar86 = auVar91._4_4_ + auVar105._4_4_;
  fVar87 = auVar91._8_4_ + auVar105._8_4_;
  fVar88 = auVar91._12_4_ + auVar105._12_4_;
  auVar91 = vsubps_avx(auVar44,auVar74);
  fVar99 = auVar44._0_4_ + auVar74._0_4_;
  fVar103 = auVar44._4_4_ + auVar74._4_4_;
  fVar130 = auVar44._8_4_ + auVar74._8_4_;
  fVar132 = auVar44._12_4_ + auVar74._12_4_;
  auVar44 = vsubps_avx(auVar96,auVar92);
  auVar98 = ZEXT1664(auVar44);
  fVar55 = auVar96._0_4_ + auVar92._0_4_;
  fVar66 = auVar96._4_4_ + auVar92._4_4_;
  fVar68 = auVar96._8_4_ + auVar92._8_4_;
  fVar71 = auVar96._12_4_ + auVar92._12_4_;
  fVar90 = auVar44._0_4_;
  auVar108._0_4_ = fVar90 * fVar99;
  fVar100 = auVar44._4_4_;
  auVar108._4_4_ = fVar100 * fVar103;
  fVar102 = auVar44._8_4_;
  auVar108._8_4_ = fVar102 * fVar130;
  fVar104 = auVar44._12_4_;
  auVar108._12_4_ = fVar104 * fVar132;
  fVar145 = auVar91._0_4_;
  auVar117._0_4_ = fVar145 * fVar55;
  fVar148 = auVar91._4_4_;
  auVar117._4_4_ = fVar148 * fVar66;
  fVar149 = auVar91._8_4_;
  auVar117._8_4_ = fVar149 * fVar68;
  fVar150 = auVar91._12_4_;
  auVar117._12_4_ = fVar150 * fVar71;
  auVar91 = vsubps_avx(auVar117,auVar108);
  fVar123 = auVar106._0_4_;
  auVar46._0_4_ = fVar123 * fVar55;
  fVar55 = auVar106._4_4_;
  auVar46._4_4_ = fVar55 * fVar66;
  fVar66 = auVar106._8_4_;
  auVar46._8_4_ = fVar66 * fVar68;
  fVar68 = auVar106._12_4_;
  auVar46._12_4_ = fVar68 * fVar71;
  auVar118._0_4_ = fVar90 * fVar73;
  auVar118._4_4_ = fVar100 * fVar86;
  auVar118._8_4_ = fVar102 * fVar87;
  auVar118._12_4_ = fVar104 * fVar88;
  auVar44 = vsubps_avx(auVar118,auVar46);
  auVar76._0_4_ = fVar145 * fVar73;
  auVar76._4_4_ = fVar148 * fVar86;
  auVar76._8_4_ = fVar149 * fVar87;
  auVar76._12_4_ = fVar150 * fVar88;
  auVar58._0_4_ = fVar123 * fVar99;
  auVar58._4_4_ = fVar55 * fVar103;
  auVar58._8_4_ = fVar66 * fVar130;
  auVar58._12_4_ = fVar68 * fVar132;
  auVar96 = vsubps_avx(auVar58,auVar76);
  local_1528._0_4_ = local_1528._4_4_;
  fStack_1520 = local_1528._4_4_;
  fStack_151c = local_1528._4_4_;
  local_1558._0_4_ = local_1558._4_4_;
  fStack_1550 = local_1558._4_4_;
  fStack_154c = local_1558._4_4_;
  local_1538._0_4_ = local_1538._4_4_;
  fStack_1530 = local_1538._4_4_;
  fStack_152c = local_1538._4_4_;
  auVar47._0_4_ =
       local_1538._4_4_ * auVar91._0_4_ +
       local_1558._4_4_ * auVar44._0_4_ + local_1528._4_4_ * auVar96._0_4_;
  auVar47._4_4_ =
       local_1538._4_4_ * auVar91._4_4_ +
       local_1558._4_4_ * auVar44._4_4_ + local_1528._4_4_ * auVar96._4_4_;
  auVar47._8_4_ =
       local_1538._4_4_ * auVar91._8_4_ +
       local_1558._4_4_ * auVar44._8_4_ + local_1528._4_4_ * auVar96._8_4_;
  auVar47._12_4_ =
       local_1538._4_4_ * auVar91._12_4_ +
       local_1558._4_4_ * auVar44._12_4_ + local_1528._4_4_ * auVar96._12_4_;
  local_13c8._0_4_ = auVar47._0_4_ + local_14e8._0_4_ + local_13f8._0_4_;
  local_13c8._4_4_ = auVar47._4_4_ + local_14e8._4_4_ + local_13f8._4_4_;
  local_13c8._8_4_ = auVar47._8_4_ + local_14e8._8_4_ + local_13f8._8_4_;
  local_13c8._12_4_ = auVar47._12_4_ + local_14e8._12_4_ + local_13f8._12_4_;
  auVar91 = vminps_avx(local_14e8,local_13f8);
  auVar91 = vminps_avx(auVar91,auVar47);
  auVar77._8_4_ = 0x7fffffff;
  auVar77._0_8_ = 0x7fffffff7fffffff;
  auVar77._12_4_ = 0x7fffffff;
  local_1408 = vandps_avx(local_13c8,auVar77);
  auVar78._0_4_ = local_1408._0_4_ * 1.1920929e-07;
  auVar78._4_4_ = local_1408._4_4_ * 1.1920929e-07;
  auVar78._8_4_ = local_1408._8_4_ * 1.1920929e-07;
  auVar78._12_4_ = local_1408._12_4_ * 1.1920929e-07;
  auVar85 = ZEXT1664(auVar78);
  uVar23 = CONCAT44(auVar78._4_4_,auVar78._0_4_);
  auVar109._0_8_ = uVar23 ^ 0x8000000080000000;
  auVar109._8_4_ = -auVar78._8_4_;
  auVar109._12_4_ = -auVar78._12_4_;
  auVar91 = vcmpps_avx(auVar91,auVar109,5);
  auVar65 = ZEXT1664(auVar91);
  auVar44 = vmaxps_avx(local_14e8,local_13f8);
  auVar44 = vmaxps_avx(auVar44,auVar47);
  auVar44 = vcmpps_avx(auVar44,auVar78,2);
  auVar54 = ZEXT1664(auVar44);
  auVar91 = vorps_avx(auVar91,auVar44);
  auVar96._8_8_ = uStack_1410;
  auVar96._0_8_ = local_1418;
  auVar96 = auVar96 & auVar91;
  if ((((auVar96 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar96 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar96 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar96[0xf] < '\0') {
    auVar48._0_4_ = fVar89 * fVar56;
    auVar48._4_4_ = fVar101 * fVar69;
    auVar48._8_4_ = fVar122 * fVar42;
    auVar48._12_4_ = fVar131 * fVar43;
    auVar59._0_4_ = fVar164 * fVar151;
    auVar59._4_4_ = fVar166 * fVar154;
    auVar59._8_4_ = fVar167 * fVar155;
    auVar59._12_4_ = fVar168 * fVar156;
    auVar105 = vsubps_avx(auVar59,auVar48);
    auVar79._0_4_ = fVar151 * fVar145;
    auVar79._4_4_ = fVar154 * fVar148;
    auVar79._8_4_ = fVar155 * fVar149;
    auVar79._12_4_ = fVar156 * fVar150;
    auVar110._0_4_ = fVar89 * fVar90;
    auVar110._4_4_ = fVar101 * fVar100;
    auVar110._8_4_ = fVar122 * fVar102;
    auVar110._12_4_ = fVar131 * fVar104;
    auVar74 = vsubps_avx(auVar110,auVar79);
    auVar44 = vandps_avx(auVar77,auVar48);
    auVar96 = vandps_avx(auVar77,auVar79);
    auVar44 = vcmpps_avx(auVar44,auVar96,1);
    local_1368 = vblendvps_avx(auVar74,auVar105,auVar44);
    auVar49._0_4_ = fVar139 * fVar90;
    auVar49._4_4_ = fVar142 * fVar100;
    auVar49._8_4_ = fVar143 * fVar102;
    auVar49._12_4_ = fVar144 * fVar104;
    auVar60._0_4_ = fVar139 * fVar56;
    auVar60._4_4_ = fVar142 * fVar69;
    auVar60._8_4_ = fVar143 * fVar42;
    auVar60._12_4_ = fVar144 * fVar43;
    auVar80._0_4_ = fVar151 * fVar157;
    auVar80._4_4_ = fVar154 * fVar161;
    auVar80._8_4_ = fVar155 * fVar162;
    auVar80._12_4_ = fVar156 * fVar163;
    auVar105 = vsubps_avx(auVar60,auVar80);
    auVar112._0_4_ = fVar151 * fVar123;
    auVar112._4_4_ = fVar154 * fVar55;
    auVar112._8_4_ = fVar155 * fVar66;
    auVar112._12_4_ = fVar156 * fVar68;
    auVar74 = vsubps_avx(auVar112,auVar49);
    auVar44 = vandps_avx(auVar77,auVar80);
    auVar96 = vandps_avx(auVar77,auVar49);
    auVar44 = vcmpps_avx(auVar44,auVar96,1);
    local_1358 = vblendvps_avx(auVar74,auVar105,auVar44);
    auVar54 = ZEXT1664(local_1358);
    auVar98 = ZEXT1664(auVar91);
    auVar38._0_4_ = fVar89 * fVar123;
    auVar38._4_4_ = fVar101 * fVar55;
    auVar38._8_4_ = fVar122 * fVar66;
    auVar38._12_4_ = fVar131 * fVar68;
    auVar61._0_4_ = fVar89 * fVar157;
    auVar61._4_4_ = fVar101 * fVar161;
    auVar61._8_4_ = fVar122 * fVar162;
    auVar61._12_4_ = fVar131 * fVar163;
    auVar81._0_4_ = fVar164 * fVar139;
    auVar81._4_4_ = fVar166 * fVar142;
    auVar81._8_4_ = fVar167 * fVar143;
    auVar81._12_4_ = fVar168 * fVar144;
    auVar113._0_4_ = fVar139 * fVar145;
    auVar113._4_4_ = fVar142 * fVar148;
    auVar113._8_4_ = fVar143 * fVar149;
    auVar113._12_4_ = fVar144 * fVar150;
    auVar105 = vsubps_avx(auVar61,auVar81);
    auVar74 = vsubps_avx(auVar113,auVar38);
    auVar44 = vandps_avx(auVar77,auVar81);
    auVar96 = vandps_avx(auVar77,auVar38);
    auVar44 = vcmpps_avx(auVar44,auVar96,1);
    local_1348 = vblendvps_avx(auVar74,auVar105,auVar44);
    fVar56 = local_1368._0_4_ * local_1538._4_4_ +
             local_1358._0_4_ * local_1558._4_4_ + local_1348._0_4_ * local_1528._4_4_;
    fVar55 = local_1368._4_4_ * local_1538._4_4_ +
             local_1358._4_4_ * local_1558._4_4_ + local_1348._4_4_ * local_1528._4_4_;
    fVar69 = local_1368._8_4_ * local_1538._4_4_ +
             local_1358._8_4_ * local_1558._4_4_ + local_1348._8_4_ * local_1528._4_4_;
    fVar66 = local_1368._12_4_ * local_1538._4_4_ +
             local_1358._12_4_ * local_1558._4_4_ + local_1348._12_4_ * local_1528._4_4_;
    auVar82._0_4_ = fVar56 + fVar56;
    auVar82._4_4_ = fVar55 + fVar55;
    auVar82._8_4_ = fVar69 + fVar69;
    auVar82._12_4_ = fVar66 + fVar66;
    fVar56 = local_1368._0_4_ * fVar8 + local_1358._0_4_ * fVar3 + local_1348._0_4_ * fVar7;
    fVar67 = local_1368._4_4_ * fVar70 + local_1358._4_4_ * fVar9 + local_1348._4_4_ * fVar67;
    fVar70 = local_1368._8_4_ * fVar11 + local_1358._8_4_ * fVar72 + local_1348._8_4_ * fVar10;
    fVar72 = local_1368._12_4_ * fVar14 + local_1358._12_4_ * fVar12 + local_1348._12_4_ * fVar13;
    auVar44 = vrcpps_avx(auVar82);
    fVar3 = auVar44._0_4_;
    auVar119._0_4_ = auVar82._0_4_ * fVar3;
    fVar7 = auVar44._4_4_;
    auVar119._4_4_ = auVar82._4_4_ * fVar7;
    fVar8 = auVar44._8_4_;
    auVar119._8_4_ = auVar82._8_4_ * fVar8;
    fVar9 = auVar44._12_4_;
    auVar119._12_4_ = auVar82._12_4_ * fVar9;
    auVar128._8_4_ = 0x3f800000;
    auVar128._0_8_ = 0x3f8000003f800000;
    auVar128._12_4_ = 0x3f800000;
    auVar44 = vsubps_avx(auVar128,auVar119);
    local_1378._0_4_ = (fVar56 + fVar56) * (fVar3 + fVar3 * auVar44._0_4_);
    local_1378._4_4_ = (fVar67 + fVar67) * (fVar7 + fVar7 * auVar44._4_4_);
    local_1378._8_4_ = (fVar70 + fVar70) * (fVar8 + fVar8 * auVar44._8_4_);
    local_1378._12_4_ = (fVar72 + fVar72) * (fVar9 + fVar9 * auVar44._12_4_);
    auVar65 = ZEXT1664(local_1378);
    uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
    auVar114._4_4_ = uVar4;
    auVar114._0_4_ = uVar4;
    auVar114._8_4_ = uVar4;
    auVar114._12_4_ = uVar4;
    auVar44 = vcmpps_avx(auVar114,local_1378,2);
    fVar3 = ray->tfar;
    auVar120._4_4_ = fVar3;
    auVar120._0_4_ = fVar3;
    auVar120._8_4_ = fVar3;
    auVar120._12_4_ = fVar3;
    auVar96 = vcmpps_avx(local_1378,auVar120,2);
    auVar44 = vandps_avx(auVar44,auVar96);
    auVar96 = vcmpps_avx(auVar82,_DAT_01f45a50,4);
    auVar44 = vandps_avx(auVar96,auVar44);
    auVar22._8_8_ = uStack_1410;
    auVar22._0_8_ = local_1418;
    auVar91 = vandps_avx(auVar91,auVar22);
    auVar44 = vpslld_avx(auVar44,0x1f);
    auVar44 = vpsrad_avx(auVar44,0x1f);
    local_13a8 = vpand_avx(auVar44,auVar91);
    auVar85 = ZEXT1664(local_13a8);
    uVar24 = vmovmskps_avx(local_13a8);
    if (uVar24 != 0) {
      local_1558 = lVar26 + uVar34;
      local_13e8 = local_14e8;
      auVar98 = ZEXT1664(local_13f8);
      local_13d8 = local_13f8;
      local_13b8 = &local_1559;
      auVar91 = vrcpps_avx(local_13c8);
      fVar3 = auVar91._0_4_;
      auVar50._0_4_ = local_13c8._0_4_ * fVar3;
      fVar7 = auVar91._4_4_;
      auVar50._4_4_ = local_13c8._4_4_ * fVar7;
      fVar8 = auVar91._8_4_;
      auVar50._8_4_ = local_13c8._8_4_ * fVar8;
      fVar9 = auVar91._12_4_;
      auVar50._12_4_ = local_13c8._12_4_ * fVar9;
      auVar62._8_4_ = 0x3f800000;
      auVar62._0_8_ = 0x3f8000003f800000;
      auVar62._12_4_ = 0x3f800000;
      auVar65 = ZEXT1664(auVar62);
      auVar91 = vsubps_avx(auVar62,auVar50);
      auVar39._0_4_ = fVar3 + fVar3 * auVar91._0_4_;
      auVar39._4_4_ = fVar7 + fVar7 * auVar91._4_4_;
      auVar39._8_4_ = fVar8 + fVar8 * auVar91._8_4_;
      auVar39._12_4_ = fVar9 + fVar9 * auVar91._12_4_;
      auVar51._8_4_ = 0x219392ef;
      auVar51._0_8_ = 0x219392ef219392ef;
      auVar51._12_4_ = 0x219392ef;
      auVar85 = ZEXT1664(local_1408);
      auVar91 = vcmpps_avx(local_1408,auVar51,5);
      auVar91 = vandps_avx(auVar91,auVar39);
      auVar52._0_4_ = local_14e8._0_4_ * auVar91._0_4_;
      auVar52._4_4_ = local_14e8._4_4_ * auVar91._4_4_;
      auVar52._8_4_ = local_14e8._8_4_ * auVar91._8_4_;
      auVar52._12_4_ = local_14e8._12_4_ * auVar91._12_4_;
      local_1398 = vminps_avx(auVar52,auVar62);
      auVar54 = ZEXT1664(local_1398);
      auVar40._0_4_ = local_13f8._0_4_ * auVar91._0_4_;
      auVar40._4_4_ = local_13f8._4_4_ * auVar91._4_4_;
      auVar40._8_4_ = local_13f8._8_4_ * auVar91._8_4_;
      auVar40._12_4_ = local_13f8._12_4_ * auVar91._12_4_;
      local_1388 = vminps_avx(auVar40,auVar62);
      uVar23 = (ulong)(uVar24 & 0xff);
      local_1528 = local_1510->scene;
      lVar26 = lVar26 + uVar34;
      pSVar31 = local_1510->scene;
      do {
        uVar25 = 0;
        if (uVar23 != 0) {
          for (; (uVar23 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
          }
        }
        local_1460 = *(uint *)(lVar26 + 0x120 + uVar25 * 4);
        pGVar6 = (pSVar31->geometries).items[local_1460].ptr;
        if ((pGVar6->mask & ray->mask) == 0) {
          uVar23 = uVar23 ^ 1L << (uVar25 & 0x3f);
        }
        else {
          local_1538 = uVar25;
          local_1498._0_8_ = uVar23;
          if ((local_1510->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00e61723;
          local_14f8._0_8_ = local_1510->args;
          local_14c8._0_8_ = lVar28;
          local_14b8._0_8_ = uVar30;
          local_14a8._0_8_ = puVar29;
          local_1448.context = local_1510->user;
          local_1478 = *(uint *)(local_1368 + uVar25 * 4);
          auVar91 = ZEXT416(local_1478);
          local_1474 = *(uint *)(local_1358 + uVar25 * 4);
          auVar44 = ZEXT416(local_1474);
          local_1470 = *(uint *)(local_1348 + uVar25 * 4);
          auVar96 = ZEXT416(local_1470);
          local_146c = *(undefined4 *)(local_1398 + uVar25 * 4);
          local_1468 = *(undefined4 *)(local_1388 + uVar25 * 4);
          local_1464 = *(undefined4 *)(local_1558 + 0x130 + uVar25 * 4);
          local_145c = (local_1448.context)->instID[0];
          local_1458 = (local_1448.context)->instPrimID[0];
          local_14d8._0_4_ = ray->tfar;
          ray->tfar = *(float *)(local_1378 + uVar25 * 4);
          local_153c = -1;
          local_1448.valid = &local_153c;
          local_1448.geometryUserPtr = pGVar6->userPtr;
          local_1508._0_8_ = ray;
          local_1448.hit = (RTCHitN *)&local_1478;
          local_1448.N = 1;
          local_14e8._0_8_ = pGVar6;
          local_1448.ray = (RTCRayN *)ray;
          if (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00e615fd:
            ray = (Ray *)local_1508._0_8_;
            if ((*(code **)(local_14f8._0_8_ + 0x10) == (code *)0x0) ||
               (((*(byte *)local_14f8._0_8_ & 2) == 0 &&
                ((*(byte *)(local_14e8._0_8_ + 0x3e) & 0x40) == 0)))) {
LAB_00e61723:
              ray->tfar = -INFINITY;
              return;
            }
            auVar65 = ZEXT1664(auVar91);
            auVar85 = ZEXT1664(auVar44);
            auVar98 = ZEXT1664(auVar96);
            (**(code **)(local_14f8._0_8_ + 0x10))(&local_1448);
            auVar54._8_56_ = extraout_var_00;
            auVar54._0_8_ = extraout_XMM1_Qa_00;
            ray = (Ray *)local_1508._0_8_;
            if (*local_1448.valid != 0) goto LAB_00e61723;
          }
          else {
            auVar65 = ZEXT464(local_1478);
            auVar85 = ZEXT464(local_1474);
            auVar98 = ZEXT464(local_1470);
            (*pGVar6->occlusionFilterN)(&local_1448);
            auVar96 = auVar98._0_16_;
            auVar44 = auVar85._0_16_;
            auVar91 = auVar65._0_16_;
            auVar54._8_56_ = extraout_var;
            auVar54._0_8_ = extraout_XMM1_Qa;
            if (*local_1448.valid != 0) goto LAB_00e615fd;
          }
          *(undefined4 *)(local_1508._0_8_ + 0x20) = local_14d8._0_4_;
          uVar23 = local_1498._0_8_ ^ 1L << (local_1538 & 0x3f);
          ray = (Ray *)local_1508._0_8_;
          lVar28 = local_14c8._0_8_;
          puVar29 = (ulong *)local_14a8._0_8_;
          uVar30 = local_14b8._0_8_;
        }
        lVar26 = local_1558;
        pSVar31 = local_1528;
      } while (uVar23 != 0);
    }
  }
  local_1480 = local_1480 + 1;
  auVar121 = ZEXT3264(local_11f8);
  auVar129 = ZEXT3264(local_1218);
  auVar136 = ZEXT3264(local_1238);
  auVar138 = ZEXT3264(local_1258);
  auVar141 = ZEXT3264(local_1278);
  auVar147 = ZEXT3264(local_1298);
  auVar153 = ZEXT3264(local_12b8);
  auVar111 = ZEXT3264(local_12d8);
  auVar115 = ZEXT3264(local_12f8);
  auVar160 = ZEXT3264(local_1318);
  auVar165 = ZEXT3264(local_1338);
  goto LAB_00e60f3a;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }